

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,unsigned_long,fmt::v8::detail::digit_grouping<char32_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned_long significand,
          int significand_size,int integral_size,char32_t decimal_point,
          digit_grouping<char32_t> *grouping)

{
  char32_t *pcVar1;
  type tVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar3;
  basic_string_view<char32_t> digits;
  basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> buffer;
  basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_> local_818;
  
  if ((grouping->sep_).thousands_sep != L'\0') {
    local_818.super_buffer<char32_t>.ptr_ = local_818.store_;
    local_818.super_buffer<char32_t>.size_ = 0;
    local_818.super_buffer<char32_t>._vptr_buffer = (_func_int **)&PTR_grow_001e6960;
    local_818.super_buffer<char32_t>.capacity_ = 500;
    write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_unsigned_long,_char32_t,_0>
              (&local_818.super_buffer<char32_t>,significand,significand_size,integral_size,
               decimal_point);
    pcVar1 = local_818.super_buffer<char32_t>.ptr_;
    tVar2 = to_unsigned<int>(integral_size);
    digits.size_._0_4_ = tVar2;
    digits.data_ = pcVar1;
    digits.size_._4_4_ = 0;
    digit_grouping<char32_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t>
              (grouping,out,digits);
    bVar3 = copy_str_noinline<char32_t,char32_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                      (local_818.super_buffer<char32_t>.ptr_ + integral_size,
                       local_818.super_buffer<char32_t>.ptr_ +
                       local_818.super_buffer<char32_t>.size_,out);
    basic_memory_buffer<char32_t,_500UL,_std::allocator<char32_t>_>::~basic_memory_buffer
              (&local_818);
    return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar3.container;
  }
  bVar3 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_unsigned_long,_char32_t,_0>
                    (out,significand,significand_size,integral_size,decimal_point);
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}